

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O0

IDeckLinkEncoderInputCallback *
cdecklink_internal_callback_create_deck_link_encoder_input_callback
          (void *ctx,undefined1 *cb0,cdecklink_encoder_input_callback_video_packet_arrived *cb1,
          cdecklink_encoder_input_callback_audio_packet_arrived *cb2)

{
  cdecklink_encoder_input_callback_audio_packet_arrived *cb2_local;
  cdecklink_encoder_input_callback_video_packet_arrived *cb1_local;
  undefined1 *cb0_local;
  void *ctx_local;
  
  if (((cb0 == (undefined1 *)0x0) &&
      (cb1 == (cdecklink_encoder_input_callback_video_packet_arrived *)0x0)) &&
     (cb2 == (cdecklink_encoder_input_callback_audio_packet_arrived *)0x0)) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = operator_new(0x30);
    DeckLinkEncoderInputCallback::DeckLinkEncoderInputCallback
              ((DeckLinkEncoderInputCallback *)ctx_local,ctx,cb0,cb1,cb2);
  }
  return (IDeckLinkEncoderInputCallback *)ctx_local;
}

Assistant:

IDeckLinkEncoderInputCallback* cdecklink_internal_callback_create_deck_link_encoder_input_callback (void *ctx, cdecklink_encoder_input_callback_video_input_signal_changed *cb0, cdecklink_encoder_input_callback_video_packet_arrived *cb1, cdecklink_encoder_input_callback_audio_packet_arrived *cb2) {
	if (cb0 != nullptr || cb1 != nullptr || cb2 != nullptr) {
		return new DeckLinkEncoderInputCallback(ctx, cb0, cb1, cb2);
	}
	return nullptr;
}